

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto_ReservedRange::InternalSwap
          (DescriptorProto_ReservedRange *this,DescriptorProto_ReservedRange *other)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  InternalMetadataWithArena *in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffffa0;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)in_RDI[1].
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    in_stack_ffffffffffffffa0 = this_00;
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_004f4c5a;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow
              ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                *)in_stack_ffffffffffffffa0);
  }
  internal::InternalMetadataWithArena::DoSwap(in_RDI,(UnknownFieldSet *)this_00);
LAB_004f4c5a:
  std::swap<unsigned_int>((uint *)(in_RDI + 2),(uint *)(in_RSI + 0x10));
  std::swap<int>((int *)(in_RDI + 3),(int *)(in_RSI + 0x18));
  std::swap<int>((int *)((long)&in_RDI[3].
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                .ptr_ + 4),(int *)(in_RSI + 0x1c));
  return;
}

Assistant:

void DescriptorProto_ReservedRange::InternalSwap(DescriptorProto_ReservedRange* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  swap(start_, other->start_);
  swap(end_, other->end_);
}